

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

void free_abbrevs(backtrace_state *state,abbrevs *abbrevs,backtrace_error_callback error_callback,
                 void *data)

{
  abbrev *p;
  long lVar1;
  size_t i;
  ulong uVar2;
  
  lVar1 = 0x18;
  uVar2 = 0;
  while( true ) {
    p = abbrevs->abbrevs;
    if (abbrevs->num_abbrevs <= uVar2) break;
    tcmalloc_backtrace_free
              (state,*(void **)((long)&p->code + lVar1),*(long *)((long)p + lVar1 + -8) << 4,
               error_callback,data);
    uVar2 = uVar2 + 1;
    lVar1 = lVar1 + 0x20;
  }
  tcmalloc_backtrace_free(state,p,abbrevs->num_abbrevs << 5,error_callback,data);
  abbrevs->num_abbrevs = 0;
  abbrevs->abbrevs = (abbrev *)0x0;
  return;
}

Assistant:

static void
free_abbrevs (struct backtrace_state *state, struct abbrevs *abbrevs,
	      backtrace_error_callback error_callback, void *data)
{
  size_t i;

  for (i = 0; i < abbrevs->num_abbrevs; ++i)
    backtrace_free (state, abbrevs->abbrevs[i].attrs,
		    abbrevs->abbrevs[i].num_attrs * sizeof (struct attr),
		    error_callback, data);
  backtrace_free (state, abbrevs->abbrevs,
		  abbrevs->num_abbrevs * sizeof (struct abbrev),
		  error_callback, data);
  abbrevs->num_abbrevs = 0;
  abbrevs->abbrevs = NULL;
}